

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O1

Triangle * GetRandomTriangle(function<float_()> *value)

{
  ulong uVar1;
  vector<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_> n;
  vector<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_> uv;
  vector<int,_std::allocator<int>_> faceIndices;
  bool bVar2;
  float *pfVar3;
  TriangleMesh *this;
  Allocator alloc;
  Triangle *pTVar4;
  char *message;
  int iVar5;
  long lVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  float fVar9;
  float fVar10;
  float fVar13;
  float fVar14;
  undefined1 auVar11 [16];
  float fVar15;
  undefined1 auVar12 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar18;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  AssertionResult gtest_ar;
  Point3f v [3];
  Point3<float> local_114;
  vector<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_> local_108;
  vector<int,_std::allocator<int>_> local_f0;
  void *local_d8;
  undefined8 uStack_d0;
  long local_c8;
  void *local_b8;
  undefined8 uStack_b0;
  long local_a8;
  void *local_98;
  undefined8 uStack_90;
  long local_88;
  vector<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_> local_78;
  int indices [3];
  int local_54;
  vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_> triVec;
  
  v[0].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  v[0].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  v[0].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  v[1].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  v[1].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  v[1].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  v[2].super_Tuple3<pbrt::Point3,_float>.x = 0.0;
  v[2].super_Tuple3<pbrt::Point3,_float>.y = 0.0;
  v[2].super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  lVar6 = 0;
  do {
    iVar5 = 0;
    do {
      if ((value->super__Function_base)._M_manager == (_Manager_type)0x0) {
        std::__throw_bad_function_call();
      }
      fVar9 = (*value->_M_invoker)((_Any_data *)value);
      pfVar3 = (float *)(v + lVar6);
      if ((iVar5 != 0) && (pfVar3 = &v[lVar6].super_Tuple3<pbrt::Point3,_float>.y, iVar5 != 1)) {
        pfVar3 = &v[lVar6].super_Tuple3<pbrt::Point3,_float>.z;
      }
      *pfVar3 = fVar9;
      iVar5 = iVar5 + 1;
    } while (iVar5 != 3);
    lVar6 = lVar6 + 1;
  } while (lVar6 != 3);
  auVar16._4_4_ = v[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar16._0_4_ = v[0].super_Tuple3<pbrt::Point3,_float>.x;
  auVar16._8_8_ = 0;
  auVar8._4_4_ = v[0].super_Tuple3<pbrt::Point3,_float>.z;
  auVar8._0_4_ = v[0].super_Tuple3<pbrt::Point3,_float>.y;
  auVar8._8_8_ = 0;
  auVar7._4_4_ = v[1].super_Tuple3<pbrt::Point3,_float>.y;
  auVar7._0_4_ = v[1].super_Tuple3<pbrt::Point3,_float>.x;
  auVar7._8_8_ = 0;
  auVar12 = vsubps_avx(auVar7,auVar16);
  auVar17._4_4_ = v[2].super_Tuple3<pbrt::Point3,_float>.z;
  auVar17._0_4_ = v[2].super_Tuple3<pbrt::Point3,_float>.y;
  auVar17._8_8_ = 0;
  auVar17 = vsubps_avx(auVar17,auVar8);
  auVar16 = vmovshdup_avx(auVar17);
  auVar7 = vpermi2ps_avx512vl(SUB6416(ZEXT464(4),0),auVar17,
                              ZEXT416((uint)(v[2].super_Tuple3<pbrt::Point3,_float>.x -
                                            v[0].super_Tuple3<pbrt::Point3,_float>.x)));
  auVar11 = ZEXT416((uint)(auVar12._0_4_ * auVar16._0_4_));
  auVar8 = vfmsub213ss_fma(ZEXT416((uint)(v[2].super_Tuple3<pbrt::Point3,_float>.x -
                                         v[0].super_Tuple3<pbrt::Point3,_float>.x)),
                           ZEXT416((uint)(v[1].super_Tuple3<pbrt::Point3,_float>.z -
                                         v[0].super_Tuple3<pbrt::Point3,_float>.z)),auVar11);
  auVar16 = vfnmadd213ss_fma(auVar16,auVar12,auVar11);
  fVar9 = auVar8._0_4_ + auVar16._0_4_;
  auVar8 = vpermi2ps_avx512vl(_DAT_005670a0,auVar12,
                              ZEXT416((uint)(v[1].super_Tuple3<pbrt::Point3,_float>.z -
                                            v[0].super_Tuple3<pbrt::Point3,_float>.z)));
  auVar11._0_4_ = auVar8._0_4_ * auVar7._0_4_;
  auVar11._4_4_ = auVar8._4_4_ * auVar7._4_4_;
  auVar11._8_4_ = auVar8._8_4_ * auVar7._8_4_;
  auVar11._12_4_ = auVar8._12_4_ * auVar7._12_4_;
  auVar16 = vfmsub213ps_fma(auVar17,auVar12,auVar11);
  auVar12 = vfnmadd213ps_fma(auVar7,auVar8,auVar11);
  fVar10 = auVar16._0_4_ + auVar12._0_4_;
  fVar13 = auVar16._4_4_ + auVar12._4_4_;
  fVar14 = auVar16._8_4_ + auVar12._8_4_;
  fVar15 = auVar16._12_4_ + auVar12._12_4_;
  auVar12._0_4_ = fVar10 * fVar10;
  auVar12._4_4_ = fVar13 * fVar13;
  auVar12._8_4_ = fVar14 * fVar14;
  auVar12._12_4_ = fVar15 * fVar15;
  auVar16 = vmovshdup_avx(auVar12);
  if (1e-20 <= auVar12._0_4_ + auVar16._0_4_ + fVar9 * fVar9) {
    if ((GetRandomTriangle(std::function<float()>)::identity == '\0') &&
       (iVar5 = __cxa_guard_acquire(&GetRandomTriangle(std::function<float()>)::identity),
       iVar5 != 0)) {
      pbrt::Transform::Transform(&GetRandomTriangle::identity);
      __cxa_guard_release(&GetRandomTriangle(std::function<float()>)::identity);
    }
    indices[0] = 0;
    indices[1] = 1;
    indices[2] = 2;
    this = (TriangleMesh *)operator_new(0x40);
    std::vector<int,std::allocator<int>>::vector<int*,void>
              ((vector<int,std::allocator<int>> *)&local_f0,indices,&local_54,
               (allocator_type *)&triVec);
    uVar18 = 0x270792;
    std::vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>>::
    vector<pbrt::Point3<float>*,void>
              ((vector<pbrt::Point3<float>,std::allocator<pbrt::Point3<float>>> *)&local_108,v,
               &local_114,(allocator_type *)&gtest_ar);
    local_78.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_98 = (void *)0x0;
    uStack_90 = 0;
    local_88 = 0;
    local_b8 = (void *)0x0;
    uStack_b0 = 0;
    local_a8 = 0;
    local_d8 = (void *)0x0;
    uStack_d0 = 0;
    local_c8 = 0;
    n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)&local_b8;
    n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)&local_98;
    n.super__Vector_base<pbrt::Normal3<float>,_std::allocator<pbrt::Normal3<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)&local_d8;
    uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffea8.ptr_;
    uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)uVar18;
    uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = in_stack_fffffffffffffeb0;
    uv.super__Vector_base<pbrt::Point2<float>,_std::allocator<pbrt::Point2<float>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ = in_stack_fffffffffffffeb4;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._1_7_ = gtest_ar._1_7_;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_start._0_1_ = gtest_ar.success_;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)gtest_ar.message_.ptr_;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._0_4_ = v[0].super_Tuple3<pbrt::Point3,_float>.x;
    faceIndices.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage._4_4_ = v[0].super_Tuple3<pbrt::Point3,_float>.y;
    pbrt::TriangleMesh::TriangleMesh
              (this,&GetRandomTriangle::identity,false,&local_f0,&local_108,&local_78,n,uv,
               faceIndices);
    if (local_d8 != (void *)0x0) {
      operator_delete(local_d8,local_c8 - (long)local_d8);
    }
    if (local_b8 != (void *)0x0) {
      operator_delete(local_b8,local_a8 - (long)local_b8);
    }
    if (local_98 != (void *)0x0) {
      operator_delete(local_98,local_88 - (long)local_98);
    }
    if (local_78.super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.
                      super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<pbrt::Vector3<float>,_std::allocator<pbrt::Vector3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_108.super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_108.
                      super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_108.
                            super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_108.
                            super__Vector_base<pbrt::Point3<float>,_std::allocator<pbrt::Point3<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_f0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    pbrt::Triangle::CreateTriangles(&triVec,this,alloc);
    testing::internal::CmpHelperEQ<int,unsigned_long>
              ((internal *)&gtest_ar,"1","triVec.size()",(int *)&stack0xfffffffffffffeb0,
               (unsigned_long *)&stack0xfffffffffffffea8);
    if (gtest_ar.success_ == false) {
      testing::Message::Message((Message *)&stack0xfffffffffffffea8);
      if (gtest_ar.message_.ptr_ ==
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        message = "";
      }
      else {
        message = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&stack0xfffffffffffffeb0,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                 ,0x97,message);
      testing::internal::AssertHelper::operator=
                ((AssertHelper *)&stack0xfffffffffffffeb0,(Message *)&stack0xfffffffffffffea8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffffeb0);
      if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            triVec.nStored !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
          (bVar2 = testing::internal::IsTrue(true), bVar2)) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)triVec.nStored
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)triVec.nStored + 8))();
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset(&gtest_ar.message_,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    uVar1 = ((triVec.ptr)->
            super_TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
            ).bits;
    pTVar4 = (Triangle *)0x0;
    if ((short)(uVar1 >> 0x30) == 4) {
      pTVar4 = (Triangle *)(uVar1 & 0xffffffffffff);
    }
    pstd::vector<pbrt::ShapeHandle,_pstd::pmr::polymorphic_allocator<pbrt::ShapeHandle>_>::~vector
              (&triVec);
  }
  else {
    pTVar4 = (Triangle *)0x0;
  }
  return pTVar4;
}

Assistant:

Triangle *GetRandomTriangle(std::function<Float()> value) {
    // Triangle vertices
    Point3f v[3];
    for (int j = 0; j < 3; ++j)
        for (int k = 0; k < 3; ++k)
            v[j][k] = value();

    if (LengthSquared(Cross(v[1] - v[0], v[2] - v[0])) < 1e-20)
        // Don't into trouble with ~degenerate triangles.
        return nullptr;

    // Create the corresponding Triangle.
    static Transform identity;
    int indices[3] = {0, 1, 2};
    // Leaks...
    TriangleMesh *mesh = new TriangleMesh(identity, false, {indices, indices + 3},
                                          {v, v + 3}, {}, {}, {}, {});
    pstd::vector<ShapeHandle> triVec = Triangle::CreateTriangles(mesh, Allocator());
    EXPECT_EQ(1, triVec.size());
    return triVec[0].CastOrNullptr<Triangle>();
}